

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O3

void __thiscall helics::FederateInfo::FederateInfo(FederateInfo *this,string *args)

{
  *(undefined8 *)
   ((long)&(this->super_CoreFederateInfo).flagProps.
           super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_CoreFederateInfo).flagProps.
           super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->super_CoreFederateInfo).flagProps.
  super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_CoreFederateInfo).flagProps.
  super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_CoreFederateInfo).intProps.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_CoreFederateInfo).intProps.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_CoreFederateInfo).timeProps.
  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_CoreFederateInfo).intProps.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_CoreFederateInfo).timeProps.
  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_CoreFederateInfo).timeProps.
  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->separator = '/';
  this->coreType = DEFAULT;
  this->brokerPort = -1;
  *(undefined4 *)&this->autobroker = 0;
  this->forceNewCore = false;
  this->useJsonSerialization = false;
  this->encrypted = false;
  (this->profilerFileName)._M_dataplus._M_p = (pointer)&(this->profilerFileName).field_2;
  (this->profilerFileName)._M_string_length = 0;
  (this->profilerFileName).field_2._M_local_buf[0] = '\0';
  (this->encryptionConfig)._M_dataplus._M_p = (pointer)&(this->encryptionConfig).field_2;
  (this->encryptionConfig)._M_string_length = 0;
  (this->encryptionConfig).field_2._M_local_buf[0] = '\0';
  (this->defName)._M_dataplus._M_p = (pointer)&(this->defName).field_2;
  (this->defName)._M_string_length = 0;
  (this->defName).field_2._M_local_buf[0] = '\0';
  (this->coreName)._M_dataplus._M_p = (pointer)&(this->coreName).field_2;
  (this->coreName)._M_string_length = 0;
  (this->coreName).field_2._M_local_buf[0] = '\0';
  (this->coreInitString)._M_dataplus._M_p = (pointer)&(this->coreInitString).field_2;
  (this->coreInitString)._M_string_length = 0;
  (this->coreInitString).field_2._M_local_buf[0] = '\0';
  (this->brokerInitString)._M_dataplus._M_p = (pointer)&(this->brokerInitString).field_2;
  (this->brokerInitString)._M_string_length = 0;
  (this->brokerInitString).field_2._M_local_buf[0] = '\0';
  (this->broker)._M_dataplus._M_p = (pointer)&(this->broker).field_2;
  (this->broker)._M_string_length = 0;
  (this->broker).field_2._M_local_buf[0] = '\0';
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  (this->key)._M_string_length = 0;
  (this->key).field_2._M_local_buf[0] = '\0';
  (this->localport)._M_dataplus._M_p = (pointer)&(this->localport).field_2;
  (this->localport)._M_string_length = 0;
  (this->localport).field_2._M_local_buf[0] = '\0';
  (this->configString)._M_dataplus._M_p = (pointer)&(this->configString).field_2;
  (this->configString)._M_string_length = 0;
  (this->configString).field_2._M_local_buf[0] = '\0';
  this->fileInUse = false;
  loadInfoFromArgsIgnoreOutput(this,args);
  return;
}

Assistant:

FederateInfo::FederateInfo(const std::string& args)
{
    loadInfoFromArgsIgnoreOutput(args);
}